

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

bool relaxedMaComma(char **p)

{
  bool bVar1;
  char **p_local;
  
  SkipBlanks(p);
  if (**p == ',') {
    if ((*p)[1] == ',') {
      bVar1 = Options::SSyntax::isMultiArgPlainComma((SSyntax *)&Options::syx);
      if (bVar1) {
        p_local._7_1_ = false;
      }
      else {
        *p = *p + 2;
        p_local._7_1_ = true;
      }
    }
    else {
      *p = *p + 1;
      p_local._7_1_ = true;
    }
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool relaxedMaComma(char* & p) {
	SkipBlanks(p);
	if (',' != p[0]) return false;		// no comma
	if (',' == p[1]) {
		// double comma detected, accept it only in --syntax=a mode
		if (Options::syx.isMultiArgPlainComma()) return false;
		p += 2;
		return true;
	}
	// single comma is enough in relaxed way, even in --syntax=a mode
	++p;
	return true;
}